

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::FunctionMocker<int_(int)>::PerformDefaultAction
          (FunctionMocker<int_(int)> *this,ArgumentTuple *args,string *call_description)

{
  bool bVar1;
  OnCallSpec<int_(int)> *this_00;
  Action<int_(int)> *this_01;
  runtime_error *this_02;
  undefined1 local_58 [8];
  string message;
  OnCallSpec<int_(int)> *spec;
  string *call_description_local;
  ArgumentTuple *args_local;
  FunctionMocker<int_(int)> *this_local;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 == (OnCallSpec<int_(int)> *)0x0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   call_description,
                   "\n    The mock function has no default action set, and its return type has no default value set."
                  );
    bVar1 = DefaultValue<int>::Exists();
    if (!bVar1) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,(string *)local_58);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_local._4_4_ = DefaultValue<int>::Get();
    std::__cxx11::string::~string((string *)local_58);
  }
  else {
    this_01 = OnCallSpec<int_(int)>::GetAction(this_00);
    std::tuple<int>::tuple((tuple<int> *)((long)&message.field_2 + 0xc),args);
    this_local._4_4_ =
         Action<int_(int)>::Perform(this_01,(ArgumentTuple *)((long)&message.field_2 + 0xc));
  }
  return this_local._4_4_;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }